

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ds_list.c
# Opt level: O3

void test_list_insert(void)

{
  UNITY_INT UVar1;
  undefined4 in_EAX;
  uint uVar2;
  int iVar3;
  undefined4 in_register_00000004;
  int i;
  long actual;
  ulong uVar4;
  undefined **ppuVar5;
  char *str;
  char *local_28;
  
  local_28 = (char *)CONCAT44(in_register_00000004,in_EAX);
  UVar1 = ds_list_size(list);
  UnityAssertEqualNumber(UVar1,0,(char *)0x0,0x35,UNITY_DISPLAY_STYLE_INT);
  ppuVar5 = &PTR_anon_var_dwarf_d7_00106d90;
  actual = 1;
  do {
    uVar2 = ds_list_append(list,*ppuVar5);
    UVar1 = ds_list_size(list);
    UnityAssertEqualNumber(UVar1,actual,(char *)0x0,0x3e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber((ulong)uVar2,0,(char *)0x0,0x3f,UNITY_DISPLAY_STYLE_INT);
    ppuVar5 = ppuVar5 + 1;
    actual = actual + 1;
  } while (actual != 4);
  iVar3 = ds_list_find_index(list,"c");
  uVar4 = 0;
  UnityAssertEqualNumber((long)iVar3,2,(char *)0x0,0x43,UNITY_DISPLAY_STYLE_INT);
  ppuVar5 = &PTR_anon_var_dwarf_d7_00106d90;
  do {
    uVar2 = ds_list_get(list,uVar4 & 0xffffffff,&local_28);
    UnityAssertEqualNumber((ulong)uVar2,0,(char *)0x0,0x48,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualString(local_28,*ppuVar5,(char *)0x0,0x49);
    uVar4 = uVar4 + 1;
    ppuVar5 = ppuVar5 + 1;
  } while (uVar4 != 3);
  uVar2 = ds_list_prepend(list);
  UnityAssertEqualNumber((ulong)uVar2,0,(char *)0x0,0x4d,UNITY_DISPLAY_STYLE_INT);
  uVar2 = ds_list_insert(list,4,"last");
  UnityAssertEqualNumber((ulong)uVar2,0,(char *)0x0,0x50,UNITY_DISPLAY_STYLE_INT);
  UVar1 = ds_list_size(list);
  UnityAssertEqualNumber(UVar1,5,(char *)0x0,0x51,UNITY_DISPLAY_STYLE_INT);
  uVar2 = ds_list_insert(list,100,"outmem");
  UnityAssertEqualNumber((ulong)uVar2,2,(char *)0x0,0x54,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_list_insert(void)
{
    TEST_ASSERT_EQUAL(ds_list_size(list), 0);

    DS_STATUS status;
    char *strs[3] = {"a", "b", "c"};
    char *str;

    for (int i = 0; i < 3; ++i)
    {
        status = ds_list_append(list, strs[i]);
        TEST_ASSERT_EQUAL(ds_list_size(list), i + 1);
        TEST_ASSERT_EQUAL(status, DS_STATUS_OK);
    }

    int index = ds_list_find_index(list, "c");
    TEST_ASSERT_EQUAL(index, 2);

    for (int i = 0; i < 3; ++i)
    {
        status = ds_list_get(list, i, (void **)&str);
        TEST_ASSERT_EQUAL(status, DS_STATUS_OK);
        TEST_ASSERT_EQUAL_STRING(str, strs[i]);
    }

    status = ds_list_prepend(list, "first");
    TEST_ASSERT_EQUAL(status, DS_STATUS_OK);

    status = ds_list_insert(list, 4, "last");
    TEST_ASSERT_EQUAL(status, DS_STATUS_OK);
    TEST_ASSERT_EQUAL(ds_list_size(list), 5);

    status = ds_list_insert(list, 100, "outmem");
    TEST_ASSERT_EQUAL(status, DS_STATUS_OUTMEM);
}